

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRHS.cpp
# Opt level: O2

void __thiscall
HDualRHS::update_weight(HDualRHS *this,HVector *column,double devex,double Kai,double *dseArray)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  HModel *pHVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  undefined4 uVar10;
  ulong uVar11;
  int i;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  
  uVar8 = rdtsc();
  uVar10 = (undefined4)((ulong)uVar8 >> 0x20);
  auVar9._4_4_ = uVar10;
  auVar9._0_4_ = uVar10;
  auVar9._8_4_ = 0;
  auVar14._0_12_ = auVar9 << 0x20;
  auVar14._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0x17] =
       (auVar14._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
  pHVar4 = this->workModel;
  pdVar5 = (this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pHVar4->numRow;
  iVar2 = column->count;
  pdVar6 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)iVar2 < 0) || ((double)(int)uVar1 * 0.4 < (double)iVar2)) {
    uVar11 = 0;
    uVar13 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar13 = uVar11;
    }
    for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      dVar15 = pdVar6[uVar11];
      dVar16 = (devex * dVar15 + dseArray[uVar11] * Kai) * dVar15 + pdVar5[uVar11];
      dVar15 = 0.0001;
      if (0.0001 <= dVar16) {
        dVar15 = dVar16;
      }
      pdVar5[uVar11] = dVar15;
    }
  }
  else {
    piVar7 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar12 = 0; iVar2 != lVar12; lVar12 = lVar12 + 1) {
      iVar3 = piVar7[lVar12];
      dVar15 = pdVar6[iVar3];
      dVar16 = (devex * dVar15 + dseArray[iVar3] * Kai) * dVar15 + pdVar5[iVar3];
      dVar15 = 0.0001;
      if (0.0001 <= dVar16) {
        dVar15 = dVar16;
      }
      pdVar5[iVar3] = dVar15;
    }
  }
  HTimer::recordFinish(&pHVar4->timer,0x17);
  return;
}

Assistant:

void HDualRHS::update_weight(HVector *column, double devex, double Kai,
        double *dseArray) {
    workModel->timer.recordStart(HTICK_UPDATE_WEIGHT);

    const int numRow = workModel->getNumRow();
    const int columnCount = column->count;
    const int *columnIndex = &column->index[0];
    const double *columnArray = &column->array[0];

    bool updateWeight_inDense = columnCount < 0 || columnCount > 0.4 * numRow;
    if (updateWeight_inDense) {
        for (int iRow = 0; iRow < numRow; iRow++) {
            const double val = columnArray[iRow];
            workEdWt[iRow] += val * (devex * val + Kai * dseArray[iRow]);
            if (workEdWt[iRow] < 1e-4)
                workEdWt[iRow] = 1e-4;
        }
    } else {
        for (int i = 0; i < columnCount; i++) {
            const int iRow = columnIndex[i];
            const double val = columnArray[iRow];
            workEdWt[iRow] += val * (devex * val + Kai * dseArray[iRow]);
            if (workEdWt[iRow] < 1e-4)
                workEdWt[iRow] = 1e-4;
        }
    }
    workModel->timer.recordFinish(HTICK_UPDATE_WEIGHT);
}